

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageColor(gdImagePtr src,int red,int green,int blue,int alpha)

{
  uint uVar1;
  int color;
  code *pcVar2;
  int iVar3;
  int a;
  int y;
  uint uVar4;
  int b;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int g;
  
  if (src == (gdImagePtr)0x0) {
    iVar6 = 0;
  }
  else {
    if (src->trueColor == 0) {
      pcVar2 = gdImageGetPixel;
    }
    else {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    iVar3 = src->sy;
    iVar6 = 1;
    if (0 < iVar3) {
      iVar6 = src->sx;
      y = 0;
      do {
        if (0 < iVar6) {
          iVar3 = 0;
          do {
            uVar1 = (*pcVar2)(src,iVar3,y);
            if (src->trueColor == 0) {
              uVar5 = src->red[(int)uVar1];
              uVar7 = src->green[(int)uVar1];
              uVar4 = src->blue[(int)uVar1];
              uVar1 = src->alpha[(int)uVar1];
            }
            else {
              uVar5 = uVar1 >> 0x10 & 0xff;
              uVar7 = uVar1 >> 8 & 0xff;
              uVar4 = uVar1 & 0xff;
              uVar1 = uVar1 >> 0x18 & 0x7f;
            }
            iVar6 = uVar5 + red;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            g = uVar7 + green;
            if (g < 1) {
              g = 0;
            }
            if (0xfe < g) {
              g = 0xff;
            }
            b = uVar4 + blue;
            if (b < 1) {
              b = 0;
            }
            if (0xfe < b) {
              b = 0xff;
            }
            a = uVar1 + alpha;
            if (a < 1) {
              a = 0;
            }
            if (0x7e < a) {
              a = 0x7f;
            }
            color = gdImageColorAllocateAlpha(src,iVar6,g,b,a);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,iVar6,g,b,a);
            }
            gdImageSetPixel(src,iVar3,y,color);
            iVar3 = iVar3 + 1;
            iVar6 = src->sx;
          } while (iVar3 < iVar6);
          iVar3 = src->sy;
        }
        y = y + 1;
      } while (y < iVar3);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

BGD_DECLARE(int) gdImageColor(gdImagePtr src, const int red, const int green, const int blue, const int alpha)
{
	int x, y;
	int new_pxl, pxl;
	FuncPtr f;

	if (src == NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			int r,g,b,a;

			pxl = f(src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			r = r + red;
			g = g + green;
			b = b + blue;
			a = a + alpha;

			r = (r > 255)? 255 : ((r < 0)? 0 : r);
			g = (g > 255)? 255 : ((g < 0)? 0 : g);
			b = (b > 255)? 255 : ((b < 0)? 0 : b);
			a = (a > 127)? 127 : ((a < 0)? 0 : a);

			new_pxl = gdImageColorAllocateAlpha(src, r, g, b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, r, g, b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}